

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceComponentsOfInterfaceVarWith
          (InterfaceVariableScalarReplacement *this,Instruction *interface_var,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *interface_var_users,NestedCompositeComponents *scalar_interface_vars,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *interface_var_component_indices,
          uint32_t *extra_array_index,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_to_composites,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_for_access_chain_to_composites)

{
  Instruction *interface_var_user_00;
  bool bVar1;
  reference ppIVar2;
  Instruction *scalar_var;
  vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
  *components;
  Instruction *interface_var_user;
  const_iterator __end3;
  const_iterator __begin3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range3;
  uint32_t *extra_array_index_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *interface_var_component_indices_local;
  NestedCompositeComponents *scalar_interface_vars_local;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *interface_var_users_local;
  Instruction *interface_var_local;
  InterfaceVariableScalarReplacement *this_local;
  
  bVar1 = NestedCompositeComponents::HasMultipleComponents(scalar_interface_vars);
  if (bVar1) {
    components = NestedCompositeComponents::GetComponents(scalar_interface_vars);
    this_local._7_1_ =
         ReplaceMultipleComponentsOfInterfaceVarWith
                   (this,interface_var,interface_var_users,components,
                    interface_var_component_indices,extra_array_index,loads_to_composites,
                    loads_for_access_chain_to_composites);
  }
  else {
    __end3 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin(interface_var_users);
    interface_var_user =
         (Instruction *)
         std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
         end(interface_var_users);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                       *)&interface_var_user), bVar1) {
      ppIVar2 = __gnu_cxx::
                __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                ::operator*(&__end3);
      interface_var_user_00 = *ppIVar2;
      scalar_var = NestedCompositeComponents::GetComponentVariable(scalar_interface_vars);
      bVar1 = ReplaceComponentOfInterfaceVarWith
                        (this,interface_var,interface_var_user_00,scalar_var,
                         interface_var_component_indices,extra_array_index,loads_to_composites,
                         loads_for_access_chain_to_composites);
      if (!bVar1) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end3);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool InterfaceVariableScalarReplacement::ReplaceComponentsOfInterfaceVarWith(
    Instruction* interface_var,
    const std::vector<Instruction*>& interface_var_users,
    const NestedCompositeComponents& scalar_interface_vars,
    std::vector<uint32_t>& interface_var_component_indices,
    const uint32_t* extra_array_index,
    std::unordered_map<Instruction*, Instruction*>* loads_to_composites,
    std::unordered_map<Instruction*, Instruction*>*
        loads_for_access_chain_to_composites) {
  if (!scalar_interface_vars.HasMultipleComponents()) {
    for (Instruction* interface_var_user : interface_var_users) {
      if (!ReplaceComponentOfInterfaceVarWith(
              interface_var, interface_var_user,
              scalar_interface_vars.GetComponentVariable(),
              interface_var_component_indices, extra_array_index,
              loads_to_composites, loads_for_access_chain_to_composites)) {
        return false;
      }
    }
    return true;
  }
  return ReplaceMultipleComponentsOfInterfaceVarWith(
      interface_var, interface_var_users, scalar_interface_vars.GetComponents(),
      interface_var_component_indices, extra_array_index, loads_to_composites,
      loads_for_access_chain_to_composites);
}